

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

SAM_hdr_tag * sam_hdr_find_key(SAM_hdr *sh,SAM_hdr_type *type,char *key,SAM_hdr_tag **prev)

{
  SAM_hdr_tag *local_40;
  SAM_hdr_tag *p;
  SAM_hdr_tag *tag;
  SAM_hdr_tag **prev_local;
  char *key_local;
  SAM_hdr_type *type_local;
  SAM_hdr *sh_local;
  
  local_40 = (SAM_hdr_tag *)0x0;
  p = type->tag;
  while( true ) {
    if (p == (SAM_hdr_tag *)0x0) {
      if (prev != (SAM_hdr_tag **)0x0) {
        *prev = local_40;
      }
      return (SAM_hdr_tag *)0x0;
    }
    if ((*p->str == *key) && (p->str[1] == key[1])) break;
    local_40 = p;
    p = p->next;
  }
  if (prev != (SAM_hdr_tag **)0x0) {
    *prev = local_40;
  }
  return p;
}

Assistant:

SAM_hdr_tag *sam_hdr_find_key(SAM_hdr *sh,
			      SAM_hdr_type *type,
			      char *key,
			      SAM_hdr_tag **prev) {
    SAM_hdr_tag *tag, *p = NULL;

    for (tag = type->tag; tag; p = tag, tag = tag->next) {
	if (tag->str[0] == key[0] && tag->str[1] == key[1]) {
	    if (prev)
		*prev = p;
	    return tag;
	}
    }

    if (prev)
	*prev = p;

    return NULL;
}